

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Frame::AddAdditionalData(Frame *this,uint8_t *additional,uint64_t length,uint64_t add_id)

{
  void *pvVar1;
  undefined8 in_RCX;
  ulong in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  uint8_t *data;
  bool local_1;
  
  pvVar1 = operator_new__(in_RDX,(nothrow_t *)&std::nothrow);
  if (pvVar1 == (void *)0x0) {
    local_1 = false;
  }
  else {
    if ((void *)in_RDI[1] != (void *)0x0) {
      operator_delete__((void *)in_RDI[1]);
    }
    in_RDI[1] = pvVar1;
    in_RDI[2] = in_RDX;
    *in_RDI = in_RCX;
    memcpy((void *)in_RDI[1],in_RSI,in_RDI[2]);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Frame::AddAdditionalData(const uint8_t* additional, uint64_t length,
                              uint64_t add_id) {
  uint8_t* const data =
      new (std::nothrow) uint8_t[static_cast<size_t>(length)];  // NOLINT
  if (!data)
    return false;

  delete[] additional_;
  additional_ = data;
  additional_length_ = length;
  add_id_ = add_id;

  memcpy(additional_, additional, static_cast<size_t>(additional_length_));
  return true;
}